

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  FORM *pFVar1;
  byte bVar2;
  _Bool _Var3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  FIELD *pFVar9;
  long *plVar10;
  ulong uVar11;
  char *pcVar12;
  reference ppfVar13;
  pointer pcVar14;
  cmState *pcVar15;
  string *args_2;
  reference pvVar16;
  cmCursesLongMessageForm *pcVar17;
  pointer pcVar18;
  pointer pcVar19;
  void *p2;
  int p1;
  int p1_00;
  int p1_01;
  int p1_02;
  int p1_03;
  int local_454;
  uint local_424;
  uint local_3f0;
  int local_3ec;
  uint local_3d0;
  uint local_3cc;
  uint local_378;
  uint local_374;
  int local_354;
  uint local_350;
  int local_34c;
  __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
  local_328;
  string *local_320;
  cmCursesCacheEntryComposite *local_318;
  __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
  local_310;
  __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
  local_308;
  __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
  nextEntryIt;
  string nextVal;
  string local_2d8;
  long *local_2b8;
  cmCursesWidget *lbl_1;
  FIELD *nextCur;
  size_t findex_3;
  FIELD *cur_3;
  cmCursesLongMessageForm *local_270;
  cmCursesLongMessageForm *msgs_1;
  cmCursesLongMessageForm *msgs;
  cmAlphaNum local_258;
  cmAlphaNum local_228;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  string *local_188;
  allocator<char> local_179;
  string local_178;
  cmValue local_158;
  cmValue existingValue;
  cmValue helpString;
  char *curField;
  cmCursesWidget *lbl;
  int findex_2;
  FIELD *cur_2;
  int findex_1;
  FIELD *cur_1;
  size_t findex;
  FIELD *cur;
  uint local_100;
  bool widgetHandled;
  int key;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined1 local_c8 [8];
  string searchstr;
  char debugMessage [128];
  cmCursesWidget *currentWidget;
  FIELD *currentField;
  int y;
  int x;
  cmCursesMainForm *this_local;
  
  currentField._0_4_ = 0;
  if ((this->super_cmCursesForm).Form == (FORM *)0x0) {
    return;
  }
  do {
    while( true ) {
      while( true ) {
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
        iVar8 = 0;
        PrintKeys(this,0);
        if ((this->SearchMode & 1U) != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,"Search: ",&this->SearchString);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
          UpdateStatusBar(this,&local_f0);
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional(&local_f0);
          PrintKeys(this,1);
          uVar5 = std::__cxx11::string::size();
          curses_move((uint)currentField - 5,uVar5);
          if (_stdscr == 0) {
            local_34c = -1;
          }
          else {
            local_34c = *(short *)(_stdscr + 4) + 1;
          }
          iVar8 = 0;
          wtouchln(_stdscr,0,local_34c,1);
          refresh();
          std::__cxx11::string::~string((string *)local_c8);
        }
        local_100 = wgetch(_stdscr);
        if (_stdscr == 0) {
          local_350 = 0xffffffff;
        }
        else {
          local_350 = (int)*(short *)(_stdscr + 4) + 1;
        }
        currentField._0_4_ = local_350;
        if (_stdscr == 0) {
          local_354 = -1;
        }
        else {
          local_354 = *(short *)(_stdscr + 6) + 1;
        }
        if ((0x40 < local_354) && (5 < (int)local_350)) break;
        if (local_100 == 0x71) {
          return;
        }
      }
      pFVar9 = current_field((this->super_cmCursesForm).Form);
      plVar10 = (long *)field_userptr(pFVar9);
      uVar5 = local_100;
      cur._7_1_ = 0;
      if ((this->SearchMode & 1U) == 0) {
        if ((plVar10 != (long *)0x0) && ((this->SearchMode & 1U) == 0)) {
          bVar2 = (**(code **)(*plVar10 + 0x10))(plVar10,&local_100,this,_stdscr);
          cur._7_1_ = bVar2 & 1;
          if (cur._7_1_ != 0) {
            this->OkToGenerate = false;
            (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
            PrintKeys(this,0);
          }
        }
      }
      else if ((local_100 == 10) || (local_100 == 0x157)) {
        this->SearchMode = false;
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          pcVar12 = (char *)std::__cxx11::string::c_str();
          JumpToCacheEntry(this,pcVar12);
          std::__cxx11::string::operator=
                    ((string *)&this->OldSearchString,(string *)&this->SearchString);
        }
        std::__cxx11::string::clear();
      }
      else if (((((int)local_100 < 0x61) || (0x7a < (int)local_100)) &&
               (((int)local_100 < 0x41 || (0x5a < (int)local_100)))) &&
              ((((int)local_100 < 0x30 || (0x39 < (int)local_100)) && (local_100 != 0x5f)))) {
        uVar6 = ctrl((EVP_PKEY_CTX *)0x68,iVar8,p1,plVar10);
        if ((((uVar5 == uVar6) || (local_100 == 0x107)) || (local_100 == 0x14a)) &&
           (uVar11 = std::__cxx11::string::empty(), (uVar11 & 1) == 0)) {
          std::__cxx11::string::pop_back();
        }
      }
      else {
        uVar11 = std::__cxx11::string::size();
        if (uVar11 < (ulong)(long)(local_354 + -10)) {
          std::__cxx11::string::operator+=((string *)&this->SearchString,(char)local_100);
        }
      }
      if (((plVar10 != (long *)0x0) && (cur._7_1_ != 0)) || ((this->SearchMode & 1U) != 0))
      goto LAB_00165a18;
      p2 = (void *)(ulong)local_100;
      iVar8 = 0x80;
      snprintf(searchstr.field_2._M_local_buf + 8,0x80,"Main form handling input, key: %d");
      cmCursesForm::LogMessage(searchstr.field_2._M_local_buf + 8);
      uVar5 = local_100;
      if (local_100 == 0x71) {
        return;
      }
      if (local_100 != 0x102) break;
LAB_00164a83:
      pFVar9 = current_field((this->super_cmCursesForm).Form);
      iVar8 = field_index(pFVar9);
      if ((long)iVar8 != this->NumberOfVisibleEntries * 3 + -1) {
        ppfVar13 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::operator[]
                             (&this->Fields,(long)iVar8 + 1);
        _Var3 = new_page(*ppfVar13);
        if (_Var3) {
          form_driver((this->super_cmCursesForm).Form,0x200);
        }
        else {
          form_driver((this->super_cmCursesForm).Form,0x204);
        }
        goto LAB_00165a18;
      }
    }
    uVar7 = ctrl((EVP_PKEY_CTX *)0x6e,iVar8,p1_00,p2);
    uVar6 = local_100;
    if ((uVar5 == uVar7) || (local_100 == 0x6a)) goto LAB_00164a83;
    if (local_100 != 0x103) {
      uVar7 = ctrl((EVP_PKEY_CTX *)0x70,iVar8,p1_01,(void *)(ulong)uVar7);
      uVar5 = local_100;
      if ((uVar6 != uVar7) && (local_100 != 0x6b)) {
        if (local_100 != 0x152) {
          uVar7 = ctrl((EVP_PKEY_CTX *)0x64,iVar8,p1_02,(void *)(ulong)uVar7);
          uVar6 = local_100;
          if (uVar5 != uVar7) {
            if ((local_100 == 0x153) ||
               (uVar5 = ctrl((EVP_PKEY_CTX *)0x75,iVar8,p1_03,(void *)(ulong)uVar7), uVar6 == uVar5)
               ) {
              form_driver((this->super_cmCursesForm).Form,0x201);
            }
            else if (local_100 == 99) {
              Configure(this,0);
            }
            else if (local_100 == 0x68) {
              if (_stdscr == 0) {
                local_374 = 0xffffffff;
              }
              else {
                local_374 = (int)*(short *)(_stdscr + 4) + 1;
              }
              currentField._0_4_ = local_374;
              if (_stdscr == 0) {
                local_378 = 0xffffffff;
              }
              else {
                local_378 = (int)*(short *)(_stdscr + 6) + 1;
              }
              pFVar9 = current_field((this->super_cmCursesForm).Form);
              iVar8 = field_index(pFVar9);
              ppfVar13 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::operator[]
                                   (&this->Fields,(long)(iVar8 + -2));
              plVar10 = (long *)field_userptr(*ppfVar13);
              pcVar12 = (char *)(**(code **)(*plVar10 + 0x28))();
              cmValue::cmValue(&existingValue,(nullptr_t)0x0);
              pcVar14 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->
                                  (&this->CMakeInstance);
              pcVar15 = cmake::GetState(pcVar14);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_178,pcVar12,&local_179);
              local_158 = cmState::GetCacheEntryValue(pcVar15,&local_178);
              std::__cxx11::string::~string((string *)&local_178);
              std::allocator<char>::~allocator(&local_179);
              bVar4 = cmValue::operator_cast_to_bool(&local_158);
              if (bVar4) {
                pcVar14 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->
                                    (&this->CMakeInstance);
                pcVar15 = cmake::GetState(pcVar14);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a8,pcVar12,&local_1a9);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1d0,"HELPSTRING",&local_1d1);
                local_188 = (string *)cmState::GetCacheEntryProperty(pcVar15,&local_1a8,&local_1d0);
                existingValue.Value = local_188;
                std::__cxx11::string::~string((string *)&local_1d0);
                std::allocator<char>::~allocator(&local_1d1);
                std::__cxx11::string::~string((string *)&local_1a8);
                std::allocator<char>::~allocator(&local_1a9);
              }
              bVar4 = cmValue::operator_cast_to_bool(&existingValue);
              if (bVar4) {
                cmAlphaNum::cmAlphaNum(&local_228,"Current option is: ");
                cmAlphaNum::cmAlphaNum(&local_258,pcVar12);
                msgs._7_1_ = 10;
                args_2 = cmValue::operator*[abi_cxx11_(&existingValue);
                msgs._6_1_ = 10;
                cmStrCat<char,char[33],std::__cxx11::string,char>
                          (&local_1f8,&local_228,&local_258,(char *)((long)&msgs + 7),
                           (char (*) [33])"Help string for this option is: ",args_2,
                           (char *)((long)&msgs + 6));
                pvVar16 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&this->HelpMessage,1);
                std::__cxx11::string::operator=((string *)pvVar16,(string *)&local_1f8);
                std::__cxx11::string::~string((string *)&local_1f8);
              }
              else {
                pvVar16 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&this->HelpMessage,1);
                std::__cxx11::string::operator=((string *)pvVar16,"");
              }
              pcVar17 = (cmCursesLongMessageForm *)operator_new(0x68);
              cmCursesLongMessageForm::cmCursesLongMessageForm
                        (pcVar17,&this->HelpMessage,"Help",NoScroll);
              cmCursesForm::CurrentForm = (cmCursesForm *)pcVar17;
              msgs_1 = pcVar17;
              (*(pcVar17->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (pcVar17,1,1,(ulong)local_378,(ulong)local_374);
              (*(msgs_1->super_cmCursesForm)._vptr_cmCursesForm[2])();
              cmCursesForm::CurrentForm = &this->super_cmCursesForm;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (this,1,1,(ulong)local_378,(ulong)local_374);
              set_current_field((this->super_cmCursesForm).Form,pFVar9);
            }
            else if (local_100 == 0x6c) {
              if (_stdscr == 0) {
                local_3cc = 0xffffffff;
              }
              else {
                local_3cc = (int)*(short *)(_stdscr + 4) + 1;
              }
              currentField._0_4_ = local_3cc;
              if (_stdscr == 0) {
                local_3d0 = 0xffffffff;
              }
              else {
                local_3d0 = (int)*(short *)(_stdscr + 6) + 1;
              }
              pcVar17 = (cmCursesLongMessageForm *)operator_new(0x68);
              cmCursesLongMessageForm::cmCursesLongMessageForm
                        (pcVar17,&this->Outputs,"CMake produced the following output",NoScroll);
              cmCursesForm::CurrentForm = (cmCursesForm *)pcVar17;
              local_270 = pcVar17;
              (*(pcVar17->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (pcVar17,1,1,(ulong)local_3d0,(ulong)local_3cc);
              (*(local_270->super_cmCursesForm)._vptr_cmCursesForm[2])();
              cmCursesForm::CurrentForm = &this->super_cmCursesForm;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])();
            }
            else if (local_100 == 0x2f) {
              this->SearchMode = true;
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::optional<const_char_(&)[7],_true>
                        ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&cur_3,(char (*) [7])"Search");
              UpdateStatusBar(this,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&cur_3);
              std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&cur_3);
              PrintKeys(this,1);
              if (_stdscr == 0) {
                local_3ec = -1;
              }
              else {
                local_3ec = *(short *)(_stdscr + 4) + 1;
              }
              wtouchln(_stdscr,0,local_3ec,1);
              refresh();
            }
            else if (local_100 == 0x6e) {
              uVar11 = std::__cxx11::string::empty();
              if ((uVar11 & 1) == 0) {
                pcVar12 = (char *)std::__cxx11::string::c_str();
                JumpToCacheEntry(this,pcVar12);
              }
            }
            else if (local_100 == 0x74) {
              this->AdvancedMode = (bool)((this->AdvancedMode ^ 0xffU) & 1);
              if (_stdscr == 0) {
                local_3f0 = 0xffffffff;
              }
              else {
                local_3f0 = (int)*(short *)(_stdscr + 4) + 1;
              }
              currentField._0_4_ = local_3f0;
              RePost(this);
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])();
            }
            else if (local_100 == 0x67) {
              if ((this->OkToGenerate & 1U) != 0) {
                Generate(this);
                return;
              }
            }
            else if (((local_100 == 100) && (this->NumberOfVisibleEntries != 0)) &&
                    ((this->IsEmpty & 1U) == 0)) {
              this->OkToGenerate = false;
              findex_3 = (size_t)current_field((this->super_cmCursesForm).Form);
              iVar8 = field_index((FIELD *)findex_3);
              nextCur = (FIELD *)(long)iVar8;
              if (nextCur == (FIELD *)0x2) {
                lbl_1 = (cmCursesWidget *)0x0;
              }
              else if (nextCur == (FIELD *)(this->NumberOfVisibleEntries * 3 + -1)) {
                ppfVar13 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::operator[]
                                     (&this->Fields,(size_type)((long)&nextCur[-1].usrptr + 3));
                lbl_1 = (cmCursesWidget *)*ppfVar13;
              }
              else {
                ppfVar13 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::operator[]
                                     (&this->Fields,(size_type)((long)&nextCur->status + 1));
                lbl_1 = (cmCursesWidget *)*ppfVar13;
              }
              ppfVar13 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::operator[]
                                   (&this->Fields,(size_type)((long)&nextCur[-1].usrptr + 6));
              local_2b8 = (long *)field_userptr(*ppfVar13);
              if (local_2b8 != (long *)0x0) {
                pcVar14 = std::unique_ptr<cmake,_std::default_delete<cmake>_>::operator->
                                    (&this->CMakeInstance);
                pcVar15 = cmake::GetState(pcVar14);
                pcVar12 = (char *)(**(code **)(*local_2b8 + 0x28))();
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2d8,pcVar12,
                           (allocator<char> *)(nextVal.field_2._M_local_buf + 0xf));
                cmState::RemoveCacheEntry(pcVar15,&local_2d8);
                std::__cxx11::string::~string((string *)&local_2d8);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(nextVal.field_2._M_local_buf + 0xf));
                std::__cxx11::string::string((string *)&nextEntryIt);
                if (lbl_1 != (cmCursesWidget *)0x0) {
                  plVar10 = (long *)field_userptr((FIELD *)lbl_1);
                  pcVar12 = (char *)(**(code **)(*plVar10 + 0x28))();
                  std::__cxx11::string::operator=((string *)&nextEntryIt,pcVar12);
                }
                if (_stdscr == 0) {
                  local_424 = 0xffffffff;
                }
                else {
                  local_424 = (int)*(short *)(_stdscr + 4) + 1;
                }
                currentField._0_4_ = local_424;
                pcVar12 = (char *)(**(code **)(*local_2b8 + 0x28))();
                RemoveEntry(this,pcVar12);
                RePost(this);
                (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])();
                if (lbl_1 != (cmCursesWidget *)0x0) {
                  local_310._M_current =
                       (cmCursesCacheEntryComposite *)
                       std::
                       vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                       ::begin(&this->Entries);
                  local_318 = (cmCursesCacheEntryComposite *)
                              std::
                              vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                              ::end(&this->Entries);
                  local_320 = (string *)&nextEntryIt;
                  local_308 = std::
                              find_if<__gnu_cxx::__normal_iterator<cmCursesCacheEntryComposite*,std::vector<cmCursesCacheEntryComposite,std::allocator<cmCursesCacheEntryComposite>>>,cmCursesMainForm::HandleInput()::__0>
                                        (local_310,
                                         (__normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
                                          )local_318,(anon_class_8_1_f1722e0e_for__M_pred)local_320)
                  ;
                  local_328._M_current =
                       (cmCursesCacheEntryComposite *)
                       std::
                       vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
                       ::end(&this->Entries);
                  bVar4 = __gnu_cxx::operator!=(&local_308,&local_328);
                  if (bVar4) {
                    pFVar1 = (this->super_cmCursesForm).Form;
                    pcVar18 = __gnu_cxx::
                              __normal_iterator<cmCursesCacheEntryComposite_*,_std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>_>
                              ::operator->(&local_308);
                    pcVar19 = std::unique_ptr<cmCursesWidget,_std::default_delete<cmCursesWidget>_>
                              ::operator->(&pcVar18->Entry);
                    set_current_field(pFVar1,pcVar19->Field);
                  }
                }
                std::__cxx11::string::~string((string *)&nextEntryIt);
              }
            }
            goto LAB_00165a18;
          }
        }
        form_driver((this->super_cmCursesForm).Form,0x200);
        goto LAB_00165a18;
      }
    }
    pFVar9 = current_field((this->super_cmCursesForm).Form);
    iVar8 = field_index(pFVar9);
    if (iVar8 != 2) {
      ppfVar13 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::operator[]
                           (&this->Fields,(long)(iVar8 + -2));
      _Var3 = new_page(*ppfVar13);
      if (_Var3) {
        form_driver((this->super_cmCursesForm).Form,0x201);
        pFVar1 = (this->super_cmCursesForm).Form;
        ppfVar13 = std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::operator[]
                             (&this->Fields,(long)(iVar8 + -3));
        set_current_field(pFVar1,*ppfVar13);
      }
      else {
        form_driver((this->super_cmCursesForm).Form,0x205);
      }
LAB_00165a18:
      if (_stdscr == 0) {
        local_454 = -1;
      }
      else {
        local_454 = *(short *)(_stdscr + 4) + 1;
      }
      wtouchln(_stdscr,0,local_454,1);
      wrefresh(_stdscr);
    }
  } while( true );
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x = 0;
  int y = 0;

  if (!this->Form) {
    return;
  }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for (;;) {
    this->UpdateStatusBar();
    this->PrintKeys();
    if (this->SearchMode) {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar(searchstr);
      this->PrintKeys(1);
      curses_move(y - 5, static_cast<unsigned int>(searchstr.size()));
      // curses_move(1,1);
      touchwin(stdscr);
      refresh();
    }
    int key = getch();

#ifdef _WIN32
    if (key == KEY_RESIZE) {
      HandleResize();
    }
#endif // _WIN32

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        break;
      }
      continue;
    }

    currentField = current_field(this->Form);
    currentWidget =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));

    bool widgetHandled = false;

    if (this->SearchMode) {
      if (key == 10 || key == KEY_ENTER) {
        this->SearchMode = false;
        if (!this->SearchString.empty()) {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
        }
        this->SearchString.clear();
      }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') || (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') || (key == '_')) {
        if (this->SearchString.size() <
            static_cast<std::string::size_type>(x - 10)) {
          this->SearchString += static_cast<char>(key);
        }
      } else if (key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC) {
        if (!this->SearchString.empty()) {
          this->SearchString.pop_back();
        }
      }
    } else if (currentWidget && !this->SearchMode) {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled) {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
      }
    }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode) {
      // If the current widget does not want to handle input,
      // we handle it.
      snprintf(debugMessage, sizeof(debugMessage),
               "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if (key == 'q') {
        break;
      }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow down, ctrl+n (emacs binding), or j (vim
      // binding)
      if (key == KEY_DOWN || key == ctrl('n') || key == 'j') {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          continue;
        }
        if (new_page(this->Fields[findex + 1])) {
          form_driver(this->Form, REQ_NEXT_PAGE);
        } else {
          form_driver(this->Form, REQ_NEXT_FIELD);
        }
      }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow up, ctrl+p (emacs binding), or k (vim binding)
      else if (key == KEY_UP || key == ctrl('p') || key == 'k') {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if (findex == 2) {
          continue;
        }
        if (new_page(this->Fields[findex - 2])) {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex - 3]);
        } else {
          form_driver(this->Form, REQ_PREV_FIELD);
        }
      }
      // pg down
      else if (key == KEY_NPAGE || key == ctrl('d')) {
        form_driver(this->Form, REQ_NEXT_PAGE);
      }
      // pg up
      else if (key == KEY_PPAGE || key == ctrl('u')) {
        form_driver(this->Form, REQ_PREV_PAGE);
      }
      // configure
      else if (key == 'c') {
        this->Configure();
      }
      // display help
      else if (key == 'h') {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        const char* curField = lbl->GetValue();
        cmValue helpString = nullptr;

        cmValue existingValue =
          this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
        if (existingValue) {
          helpString = this->CMakeInstance->GetState()->GetCacheEntryProperty(
            curField, "HELPSTRING");
        }
        if (helpString) {
          this->HelpMessage[1] =
            cmStrCat("Current option is: ", curField, '\n',
                     "Help string for this option is: ", *helpString, '\n');
        } else {
          this->HelpMessage[1] = "";
        }

        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
          this->HelpMessage, "Help",
          cmCursesLongMessageForm::ScrollBehavior::NoScroll);
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
        set_current_field(this->Form, cur);
      }
      // display last errors
      else if (key == 'l') {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
          this->Outputs, "CMake produced the following output",
          cmCursesLongMessageForm::ScrollBehavior::NoScroll);
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
      } else if (key == '/') {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
      } else if (key == 'n') {
        if (!this->OldSearchString.empty()) {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
        }
      }
      // switch advanced on/off
      else if (key == 't') {
        this->AdvancedMode = !this->AdvancedMode;
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
      }
      // generate and exit
      else if (key == 'g') {
        if (this->OkToGenerate) {
          this->Generate();
          break;
        }
      }
      // delete cache entry
      else if (key == 'd' && this->NumberOfVisibleEntries && !this->IsEmpty) {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if (findex == 2) {
          nextCur = nullptr;
        } else if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          nextCur = this->Fields[findex - 5];
        } else {
          nextCur = this->Fields[findex + 1];
        }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        if (lbl) {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur) {
            nextVal =
              (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))
                 ->GetValue());
          }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur) {
            // make the next or prev. current field after deletion
            auto nextEntryIt = std::find_if(
              this->Entries.begin(), this->Entries.end(),
              [&nextVal](cmCursesCacheEntryComposite const& entry) {
                return nextVal == entry.Key;
              });

            if (nextEntryIt != this->Entries.end()) {
              set_current_field(this->Form, nextEntryIt->Entry->Field);
            }
          }
        }
      }
    }

    touchwin(stdscr);
    wrefresh(stdscr);
  }
}